

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int replace_pattr(attr_list list,atom_t attr_id,attr_value_type val_type,attr_union value)

{
  int_attr_struct *piVar1;
  attr_p paVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  if (list->list_of_lists != 0) {
    __assert_fail("list->list_of_lists == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/atl/atl/attr.c"
                  ,0x301,"int replace_pattr(attr_list, atom_t, attr_value_type, attr_union)");
  }
  if (val_type == Attr_Int4) {
    piVar1 = (list->l).list.iattrs;
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (piVar1->int_attr_count == uVar5) {
        return 0;
      }
      uVar3 = uVar5 + 1;
    } while (piVar1->iattr[uVar5].attr_id != attr_id);
    piVar1->iattr[uVar5].value = (int4)value.u.f;
  }
  else {
    lVar4 = 0;
    do {
      lVar6 = lVar4;
      if ((ulong)((list->l).list.iattrs)->other_attr_count * 0x18 + 0x18 == lVar6 + 0x18) {
        return 0;
      }
      paVar2 = (list->l).list.attributes;
      lVar4 = lVar6 + 0x18;
    } while (*(int *)((long)&paVar2->attr_id + lVar6) != attr_id);
    *(attr_value_type *)((long)&paVar2->val_type + lVar6) = val_type;
    paVar2 = (list->l).list.attributes;
    *(double *)((long)&(paVar2->value).u + lVar6) = value.u.d;
    *(long *)((long)&(paVar2->value).u + lVar6 + 8) = value.u._8_8_;
  }
  return 1;
}

Assistant:

extern int
replace_pattr(attr_list list, atom_t attr_id, attr_value_type val_type, attr_union value)
{
    int index = 0;
    assert(list->list_of_lists == 0);
    if (val_type == Attr_Int4) {
	while (index < list->l.list.iattrs->int_attr_count) {
	    if (list->l.list.iattrs->iattr[index].attr_id == attr_id) {
		list->l.list.iattrs->iattr[index].value = (int4)(long)value.u.i;
		return 1;
	    }
	    index++;
	}
    } else {
	while (index < list->l.list.iattrs->other_attr_count) {
	    if (list->l.list.attributes[index].attr_id == attr_id) {
		list->l.list.attributes[index].val_type = val_type;
		list->l.list.attributes[index].value = value;
		return 1;
	    }
	    index++;
	}
    }
    return 0;  
}